

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_htmlParseCharRef(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_48;
  undefined *local_40;
  PyObject *pyobj_ctxt;
  htmlParserCtxtPtr ctxt;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("htmlParseCharRef");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"O:htmlParseCharRef",&local_40);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (local_40 == &_Py_NoneStruct) {
        local_48 = (PyObject *)0x0;
      }
      else {
        local_48 = *(PyObject **)(local_40 + 0x10);
      }
      pyobj_ctxt = local_48;
      ctxt._4_4_ = htmlParseCharRef(local_48);
      self_local = libxml_intWrap(ctxt._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_htmlParseCharRef(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    htmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;

    if (libxml_deprecationWarning("htmlParseCharRef") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"O:htmlParseCharRef", &pyobj_ctxt))
        return(NULL);
    ctxt = (htmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    c_retval = htmlParseCharRef(ctxt);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}